

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::internal::LegacyTraceId::Write
          (LegacyTraceId *this,LegacyEvent *event,uint32_t event_flags)

{
  uint uVar1;
  ulong value;
  uint64_t id;
  allocator<char> local_49;
  uint64_t local_48;
  string local_40;
  
  if ((event_flags & 0x180) != 0) {
    value = *(ulong *)(this + 0x18);
    if ((*(uint *)(this + 0x20) >> 0xb & 1) != 0) {
      value = value ^ Track::process_uuid;
      Platform::GetCurrentProcessId();
    }
    protos::pbzero::TrackEvent_LegacyEvent::set_bind_id(event,value);
    return;
  }
  uVar1 = *(uint *)(this + 0x20) & 0x1802;
  local_48 = *(uint64_t *)(this + 0x18);
  if (uVar1 != 0x1000 && *(long *)this != 0) {
    local_48 = base::Hash::Combine<unsigned_long&,char_const*const&>(&local_48,(char **)this);
  }
  if (uVar1 == 0x1000) {
    protos::pbzero::TrackEvent_LegacyEvent::set_global_id(event,local_48);
  }
  else if (uVar1 == 0x800) {
    protos::pbzero::TrackEvent_LegacyEvent::set_local_id(event,local_48);
  }
  else if (uVar1 == 2) {
    protos::pbzero::TrackEvent_LegacyEvent::set_unscoped_id(event,local_48);
  }
  if (*(char **)this != (char *)0x0) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,*(char **)this,&local_49);
    protos::pbzero::TrackEvent_LegacyEvent::set_id_scope(event,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void LegacyTraceId::Write(protos::pbzero::TrackEvent::LegacyEvent* event,
                          uint32_t event_flags) const {
  // Legacy flow events always use bind_id.
  if (event_flags &
      (legacy::kTraceEventFlagFlowOut | legacy::kTraceEventFlagFlowIn)) {
    // Flow bind_ids don't have scopes, so we need to mangle in-process ones to
    // avoid collisions.
    if (id_flags_ & legacy::kTraceEventFlagHasLocalId) {
      event->set_bind_id(raw_id_ ^ ProcessTrack::Current().uuid);
    } else {
      event->set_bind_id(raw_id_);
    }
    return;
  }

  uint32_t scope_flags = id_flags_ & (legacy::kTraceEventFlagHasId |
                                      legacy::kTraceEventFlagHasLocalId |
                                      legacy::kTraceEventFlagHasGlobalId);
  uint64_t id = raw_id_;
  if (scope_ && scope_flags != legacy::kTraceEventFlagHasGlobalId) {
    id = base::Hash::Combine(id, scope_);
  }

  switch (scope_flags) {
    case legacy::kTraceEventFlagHasId:
      event->set_unscoped_id(id);
      break;
    case legacy::kTraceEventFlagHasLocalId:
      event->set_local_id(id);
      break;
    case legacy::kTraceEventFlagHasGlobalId:
      event->set_global_id(id);
      break;
  }
  if (scope_)
    event->set_id_scope(scope_);
}